

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fortran.c
# Opt level: O1

REF_STATUS
ref_fortran_import_face_(REF_INT *face_index,REF_INT *node_per_face,REF_INT *nface,REF_INT *f2n)

{
  int iVar1;
  int iVar2;
  REF_NODE pRVar3;
  bool bVar4;
  REF_GRID_conflict pRVar5;
  uint uVar6;
  REF_INT *nodes;
  long lVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  REF_CELL ref_cell;
  REF_INT new_face;
  REF_CELL local_40;
  REF_INT local_34;
  
  pRVar3 = ref_grid->node;
  uVar6 = ref_grid_face_with(ref_grid,*node_per_face,&local_40);
  if (uVar6 == 0) {
    if (*node_per_face < -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
             0x65,"ref_fortran_import_face_","malloc nodes of REF_INT negative");
      uVar6 = 1;
    }
    else {
      nodes = (REF_INT *)malloc((ulong)(*node_per_face + 1) << 2);
      if (nodes == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
               0x65,"ref_fortran_import_face_","malloc nodes of REF_INT NULL");
        uVar6 = 2;
      }
      else {
        if (0 < *nface) {
          iVar9 = 0;
          do {
            pRVar5 = ref_grid;
            iVar1 = *node_per_face;
            lVar7 = (long)iVar1;
            if (lVar7 < 1) {
              nodes[lVar7] = *face_index;
            }
            else {
              lVar8 = 0;
              bVar10 = false;
              do {
                iVar2 = f2n[(ulong)(uint)(iVar1 * iVar9) + lVar8];
                nodes[lVar8] = iVar2 + -1;
                bVar4 = !bVar10;
                bVar10 = true;
                if (bVar4) {
                  bVar10 = pRVar5->mpi->id == pRVar3->part[(long)iVar2 + -1];
                }
                lVar8 = lVar8 + 1;
              } while (lVar7 != lVar8);
              nodes[lVar7] = *face_index;
              if ((bVar10) && (uVar6 = ref_cell_add(local_40,nodes,&local_34), uVar6 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c"
                       ,0x71,"ref_fortran_import_face_",(ulong)uVar6,"add face");
                return uVar6;
              }
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < *nface);
        }
        free(nodes);
        uVar6 = 0;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",99,
           "ref_fortran_import_face_",(ulong)uVar6,"get face");
  }
  return uVar6;
}

Assistant:

REF_STATUS REF_FORT_(ref_fortran_import_face,
                     REF_FORTRAN_IMPORT_FACE)(REF_INT *face_index,
                                              REF_INT *node_per_face,
                                              REF_INT *nface, REF_INT *f2n) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *nodes;
  REF_CELL ref_cell;
  REF_INT face, node, new_face;
  REF_BOOL has_a_local_node;

  RSS(ref_grid_face_with(ref_grid, *node_per_face, &ref_cell), "get face");

  ref_malloc(nodes, (*node_per_face) + 1, REF_INT);
  RNS(nodes, "malloc nodes NULL");
  for (face = 0; face < (*nface); face++) {
    has_a_local_node = REF_FALSE;
    for (node = 0; node < (*node_per_face); node++) {
      nodes[node] = f2n[node + (*node_per_face) * face] - 1;
      has_a_local_node =
          has_a_local_node || (ref_mpi_rank(ref_grid_mpi(ref_grid)) ==
                               ref_node_part(ref_node, nodes[node]));
    }
    nodes[(*node_per_face)] = (*face_index);
    if (has_a_local_node)
      RSS(ref_cell_add(ref_cell, nodes, &new_face), "add face");
  }
  free(nodes);
  return REF_SUCCESS;
}